

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

string * find_in_path(string *__return_storage_ptr__,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *paths,string *fname)

{
  int iVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pbVar4;
  string delimiter;
  string path;
  ifstream f;
  int aiStack_218 [122];
  
  std::__cxx11::string::string((string *)&delimiter,"/",(allocator *)&f);
  pbVar4 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar4 == pbVar2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&f);
LAB_0011da73:
      std::__cxx11::string::~string((string *)&delimiter);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&path,(string *)pbVar4);
    bVar3 = ends_with(&path,&delimiter);
    if (bVar3) {
      std::operator+(__return_storage_ptr__,&path,fname);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&path,
                     &delimiter);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,fname);
      std::__cxx11::string::~string((string *)&f);
    }
    std::ifstream::ifstream
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
               (__return_storage_ptr__->_M_dataplus)._M_p,_S_in);
    iVar1 = *(int *)((long)aiStack_218 + *(long *)(_f + -0x18));
    std::ifstream::~ifstream
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
    if (iVar1 == 0) {
      std::__cxx11::string::~string((string *)&path);
      goto LAB_0011da73;
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&path);
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

string find_in_path(vector<string> paths, string fname)
{
#ifdef _WIN32
  string delimiter = "\\";
#else
  string delimiter = "/";
#endif
  for (string path : paths)
  {
    string full = ends_with(path, delimiter) ? (path + fname) : (path + delimiter + fname);
    ifstream f(full.c_str());
    if (f.good())
      return full;
  }
  return "";
}